

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpHeaderBase.cpp
# Opt level: O3

ErrCode __thiscall HttpHeaderBase::removeField(HttpHeaderBase *this,FieldType type)

{
  ErrCode EVar1;
  int iVar2;
  ulong uVar3;
  HeaderField *pHVar4;
  ulong uVar5;
  long lVar6;
  
  uVar3 = (ulong)this->mNumFields;
  if ((long)uVar3 < 1) {
    return kNotFound;
  }
  if (this->mFields[0].mType == type) {
    uVar5 = 0;
    EVar1 = kNoError;
  }
  else {
    pHVar4 = this->mFields;
    uVar5 = 0;
    do {
      pHVar4 = pHVar4 + 1;
      if (uVar3 - 1 == uVar5) {
        return kNotFound;
      }
      uVar5 = uVar5 + 1;
    } while (pHVar4->mType != type);
    EVar1 = (ErrCode)(uVar3 <= uVar5);
  }
  iVar2 = this->mNumFields + -1;
  if ((int)uVar5 < iVar2) {
    pHVar4 = this->mFields + uVar5 + 1;
    do {
      uVar5 = uVar5 + 1;
      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)(pHVar4 + -1))->_M_allocated_capacity = *(size_type *)pHVar4;
      *(char **)((long)(pHVar4 + -1) + 8) = pHVar4->mData;
      lVar6 = (long)this->mNumFields + -1;
      pHVar4 = pHVar4 + 1;
    } while ((long)uVar5 < lVar6);
    iVar2 = (int)lVar6;
  }
  else {
    lVar6 = (long)iVar2;
  }
  this->mFields[lVar6].mData = (char *)0x0;
  this->mNumFields = iVar2;
  return EVar1;
}

Assistant:

ErrCode HttpHeaderBase::removeField(FieldMap::FieldType type)
{
	TRACE_BEGIN(LOG_LVL_NOISE);

	for (int i = 0; i < mNumFields; i++)
	{
		if (mFields[i].mType == type)
		{
			for (int j = i; j < mNumFields - 1; j++)
			{
				mFields[j] = mFields[j + 1];
			}
			mFields[mNumFields - 1].mData = NULL;
			mNumFields--;
			return JetHead::kNoError;
		}
	}
	return JetHead::kNotFound;
}